

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O2

void __thiscall cppurses::Text_display::append(Text_display *this,Glyph_string *text)

{
  pointer pGVar1;
  pointer pGVar2;
  long lVar3;
  
  pGVar1 = (text->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>).
           super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pGVar2 = (text->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>).
                super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                super__Vector_impl_data._M_start; pGVar2 != pGVar1; pGVar2 = pGVar2 + 1) {
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      if (((this->insert_brush).attributes_.super__Base_bitset<1UL>._M_w >>
           ((ulong)(byte)(&Attribute_list)[lVar3] & 0x3f) & 1) != 0) {
        Brush::set_attr(&pGVar2->brush,(&Attribute_list)[lVar3]);
      }
    }
  }
  Glyph_string::append<>(&this->contents_,text);
  (*(this->super_Widget)._vptr_Widget[3])(this);
  sig::
  Signal<void(cppurses::Glyph_string_const&),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(cppurses::Glyph_string_const&)>,std::mutex>
  ::operator()((Signal<void(cppurses::Glyph_string_const&),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(cppurses::Glyph_string_const&)>,std::mutex>
                *)&this->contents_modified,&this->contents_);
  return;
}

Assistant:

void Text_display::append(Glyph_string text) {
    for (auto& glyph : text) {
        for (Attribute a : Attribute_list) {
            if (this->insert_brush.has_attribute(a)) {
                glyph.brush.add_attributes(a);
            }
        }
    }
    contents_.append(text);
    this->update();
    contents_modified(contents_);
}